

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parents.h
# Opt level: O1

void __thiscall wasm::Parents::~Parents(Parents *this)

{
  pointer ppEVar1;
  pointer pTVar2;
  
  std::
  _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Expression_*>,_std::_Select1st<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_*>_>_>
  ::~_Rb_tree(&(this->inner).parentMap._M_t);
  ppEVar1 = (this->inner).
            super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
            .expressionStack.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)*(pointer *)
                                   ((long)&(this->inner).
                                           super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
                                           .expressionStack.flexible.
                                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           ._M_impl.super__Vector_impl_data + 0x10) - (long)ppEVar1)
    ;
  }
  pTVar2 = (this->inner).
           super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .
           super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .
           super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->inner).
                                          super_ExpressionStackWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
                                          .
                                          super_PostWalker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
                                          .
                                          super_Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::Task>_>
                                  + 0x10) - (long)pTVar2);
    return;
  }
  return;
}

Assistant:

Parents(Expression* expr) { inner.walk(expr); }